

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall
Inline::InsertInlineeBuiltInStartEndTags
          (Inline *this,Instr *callInstr,uint actualCount,Instr **builtinStartInstr)

{
  Instr *pIVar1;
  IntConstOpnd *newSrc;
  
  pIVar1 = IR::Instr::New(InlineBuiltInStart,callInstr->m_func);
  IR::Instr::SetSrc1(pIVar1,callInstr->m_src1);
  IR::Instr::SetSrc2(pIVar1,callInstr->m_src2);
  IR::Instr::SetByteCodeOffset(pIVar1,callInstr);
  IR::Instr::InsertBefore(callInstr,pIVar1);
  if (builtinStartInstr != (Instr **)0x0) {
    *builtinStartInstr = pIVar1;
  }
  pIVar1 = IR::Instr::New(InlineBuiltInEnd,callInstr->m_func);
  newSrc = IR::IntConstOpnd::New((ulong)actualCount,TyInt32,callInstr->m_func,false);
  IR::Instr::SetSrc1(pIVar1,&newSrc->super_Opnd);
  IR::Instr::SetSrc2(pIVar1,callInstr->m_src2);
  IR::Instr::SetByteCodeOffset(pIVar1,callInstr);
  IR::Instr::InsertAfter(callInstr,pIVar1);
  return pIVar1;
}

Assistant:

IR::Instr* Inline::InsertInlineeBuiltInStartEndTags(IR::Instr* callInstr, uint actualCount, IR::Instr** builtinStartInstr)
{
    IR::Instr* inlineBuiltInStartInstr = IR::Instr::New(Js::OpCode::InlineBuiltInStart, callInstr->m_func);
    inlineBuiltInStartInstr->SetSrc1(callInstr->GetSrc1());
    inlineBuiltInStartInstr->SetSrc2(callInstr->GetSrc2());
    inlineBuiltInStartInstr->SetByteCodeOffset(callInstr);
    callInstr->InsertBefore(inlineBuiltInStartInstr);
    if (builtinStartInstr)
    {
        *builtinStartInstr = inlineBuiltInStartInstr;
    }

    IR::Instr* inlineBuiltInEndInstr = IR::Instr::New(Js::OpCode::InlineBuiltInEnd, callInstr->m_func);
    inlineBuiltInEndInstr->SetSrc1(IR::IntConstOpnd::New(actualCount, TyInt32, callInstr->m_func));
    inlineBuiltInEndInstr->SetSrc2(callInstr->GetSrc2());
    inlineBuiltInEndInstr->SetByteCodeOffset(callInstr);
    callInstr->InsertAfter(inlineBuiltInEndInstr);
    return inlineBuiltInEndInstr;
}